

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

uint Abc_TtCanonicizeCA(Abc_TtHieMan_t *p,word *pTruth,int nVars,char *pCanonPerm,int fCA)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  Abc_SccCost_t AVar5;
  int local_210;
  int local_1e0;
  Abc_SccCost_t sc;
  Abc_TgMan_t tgManCopy;
  Abc_TgMan_t tgMan;
  uint fHash;
  uint fHard;
  int nWords;
  int fCA_local;
  char *pCanonPerm_local;
  int nVars_local;
  word *pTruth_local;
  Abc_TtHieMan_t *p_local;
  
  iVar1 = Abc_TtWordNum(nVars);
  tgMan.vPhase._4_4_ = 0;
  tgMan.vPhase._0_4_ = 0x20000000;
  if (nVars == 0) {
    Abc_TtClear(pTruth,iVar1);
    p_local._4_4_ = 0;
  }
  else {
    Abc_TtVerifySmallTruth(pTruth,nVars);
    Abc_TtCopy(gpVerCopy,pTruth,iVar1,0);
    if (0x10 < nVars) {
      __assert_fail("nVars <= 16",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                    ,0xa5b,
                    "unsigned int Abc_TtCanonicizeCA(Abc_TtHieMan_t *, word *, int, char *, int)");
    }
    if (p == (Abc_TtHieMan_t *)0x0) {
      __assert_fail("p != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                    ,0xa5c,
                    "unsigned int Abc_TtCanonicizeCA(Abc_TtHieMan_t *, word *, int, char *, int)");
    }
    iVar2 = Abc_TtHieRetrieveOrInsert(p,-5,pTruth,pTruth);
    if (iVar2 < 1) {
      Abc_TgInitMan((Abc_TgMan_t *)&tgManCopy.vPhase,pTruth,nVars,2,p->vPhase);
      Abc_TgCreateGroups((Abc_TgMan_t *)&tgManCopy.vPhase);
      if ((p != (Abc_TtHieMan_t *)0x0) &&
         (iVar2 = Abc_TtHieRetrieveOrInsert(p,-4,pTruth,pTruth), 0 < iVar2)) {
        return (uint)tgMan.vPhase;
      }
      Abc_TgPurgeSymmetry((Abc_TgMan_t *)&tgManCopy.vPhase,1);
      Abc_TgExpendSymmetry((Abc_TgMan_t *)&tgManCopy.vPhase,pCanonPerm);
      Abc_TgImplementPerm((Abc_TgMan_t *)&tgManCopy.vPhase,pCanonPerm);
      iVar2 = Abc_TgCannonVerify((Abc_TgMan_t *)&tgManCopy.vPhase);
      if (iVar2 == 0) {
        __assert_fail("Abc_TgCannonVerify(&tgMan)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                      ,0xa66,
                      "unsigned int Abc_TtCanonicizeCA(Abc_TtHieMan_t *, word *, int, char *, int)")
        ;
      }
      iVar2 = Abc_TtHieRetrieveOrInsert(p,-3,pTruth,pTruth);
      if (iVar2 < 1) {
        Abc_TgManCopy((Abc_TgMan_t *)&sc.cPhase,Abc_TtCanonicizeCA::pCopy,
                      (Abc_TgMan_t *)&tgManCopy.vPhase);
        Abc_TgSimpleEnumeration((Abc_TgMan_t *)&tgManCopy.vPhase);
        iVar2 = Abc_TtHieRetrieveOrInsert(p,-2,pTruth,pTruth);
        if (iVar2 < 1) {
          Abc_TgManCopy((Abc_TgMan_t *)&tgManCopy.vPhase,pTruth,(Abc_TgMan_t *)&sc.cPhase);
          Abc_TtFill(pTruth,iVar1);
          iVar1 = Abc_TgCannonVerify((Abc_TgMan_t *)&sc.cPhase);
          if (iVar1 == 0) {
            __assert_fail("Abc_TgCannonVerify(&tgManCopy)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                          ,0xa6f,
                          "unsigned int Abc_TtCanonicizeCA(Abc_TtHieMan_t *, word *, int, char *, int)"
                         );
          }
          AVar5 = Abc_TgRecordPhase((Abc_TgMan_t *)&sc.cPhase,0);
          local_1e0 = AVar5.cPerm;
          sc.cNeg = local_1e0;
          if (fCA != 0) {
            dVar3 = Abc_SccEnumCost((Abc_TgMan_t *)&sc.cPhase,AVar5);
            dVar4 = Abc_SccPhaseCost((Abc_TgMan_t *)&sc.cPhase);
            if (dVar4 < dVar3) {
              Abc_TgResetGroup((Abc_TgMan_t *)&sc.cPhase);
              AVar5 = Abc_TgRecordPhase((Abc_TgMan_t *)&sc.cPhase,1);
              local_210 = AVar5.cPerm;
              sc.cNeg = local_210;
              tgMan.vPhase._4_4_ = 0x10000000;
            }
          }
          Abc_TgFullEnumeration((Abc_TgMan_t *)&sc.cPhase,(Abc_TgMan_t *)&tgManCopy.vPhase);
          Abc_TtHieRetrieveOrInsert(p,-1,pTruth,pTruth);
          memcpy(pCanonPerm,tgMan.pPerm + 8,(long)nVars);
          iVar1 = Abc_TgCannonVerify((Abc_TgMan_t *)&tgManCopy.vPhase);
          if (iVar1 == 0) {
            printf("Canonical form verification failed!\n");
          }
          p_local._4_4_ = tgMan.nGVars | tgMan.vPhase._4_4_;
        }
        else {
          p_local._4_4_ = (uint)tgMan.vPhase;
        }
      }
      else {
        p_local._4_4_ = (uint)tgMan.vPhase;
      }
    }
    else {
      p_local._4_4_ = (uint)tgMan.vPhase;
    }
  }
  return p_local._4_4_;
}

Assistant:

unsigned Abc_TtCanonicizeCA(Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int fCA)
{
    int nWords = Abc_TtWordNum(nVars);
    unsigned fHard = 0, fHash = 1 << 29;
    static word pCopy[1024];
    Abc_TgMan_t tgMan, tgManCopy;
    Abc_SccCost_t sc;

    // handle constant
    if (nVars == 0) {
        Abc_TtClear(pTruth, nWords);
        return 0;
    }

    Abc_TtVerifySmallTruth(pTruth, nVars);
#ifdef CANON_VERIFY
    Abc_TtCopy(gpVerCopy, pTruth, nWords, 0);
#endif

    assert(nVars <= 16);
    assert(p != NULL);
    if (Abc_TtHieRetrieveOrInsert(p, -5, pTruth, pTruth) > 0) return fHash;
    Abc_TgInitMan(&tgMan, pTruth, nVars, 2, p->vPhase);

    Abc_TgCreateGroups(&tgMan);
    if (p && Abc_TtHieRetrieveOrInsert(p, -4, pTruth, pTruth) > 0) return fHash;
    Abc_TgPurgeSymmetry(&tgMan, 1);

    Abc_TgExpendSymmetry(&tgMan, pCanonPerm);
    Abc_TgImplementPerm(&tgMan, pCanonPerm);
    assert(Abc_TgCannonVerify(&tgMan));

    if (Abc_TtHieRetrieveOrInsert(p, -3, pTruth, pTruth) > 0) return fHash;
    Abc_TgManCopy(&tgManCopy, pCopy, &tgMan);
    Abc_TgSimpleEnumeration(&tgMan);
    if (Abc_TtHieRetrieveOrInsert(p, -2, pTruth, pTruth) > 0) return fHash;
    Abc_TgManCopy(&tgMan, pTruth, &tgManCopy);
    Abc_TtFill(pTruth, nWords);

    assert(Abc_TgCannonVerify(&tgManCopy));
    sc = Abc_TgRecordPhase(&tgManCopy, 0);
    if (fCA && Abc_SccEnumCost(&tgManCopy, sc) > Abc_SccPhaseCost(&tgManCopy))
    {
        Abc_TgResetGroup(&tgManCopy);
        sc = Abc_TgRecordPhase(&tgManCopy, 1);
        fHard = 1 << 28;
    }
    Abc_TgFullEnumeration(&tgManCopy, &tgMan);
    Abc_TtHieRetrieveOrInsert(p, -1, pTruth, pTruth);
    memcpy(pCanonPerm, tgMan.pPermT, sizeof(char) * nVars);

#ifdef CANON_VERIFY
    if (!Abc_TgCannonVerify(&tgMan))
        printf("Canonical form verification failed!\n");
#endif
    return tgMan.uPhase | fHard;
}